

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.h
# Opt level: O2

QRhiVertexInputLayout * __thiscall
QRhiVertexInputLayout::operator=(QRhiVertexInputLayout *this,QRhiVertexInputLayout *param_1)

{
  QVarLengthArray<QRhiVertexInputBinding,_8LL>::operator=(&this->m_bindings,&param_1->m_bindings);
  QVarLengthArray<QRhiVertexInputAttribute,_8LL>::operator=
            (&this->m_attributes,&param_1->m_attributes);
  return this;
}

Assistant:

class Q_GUI_EXPORT QRhiVertexInputLayout
{
public:
    QRhiVertexInputLayout() = default;

    void setBindings(std::initializer_list<QRhiVertexInputBinding> list) { m_bindings = list; }
    template<typename InputIterator>
    void setBindings(InputIterator first, InputIterator last)
    {
        m_bindings.clear();
        std::copy(first, last, std::back_inserter(m_bindings));
    }
    const QRhiVertexInputBinding *cbeginBindings() const { return m_bindings.cbegin(); }
    const QRhiVertexInputBinding *cendBindings() const { return m_bindings.cend(); }
    const QRhiVertexInputBinding *bindingAt(qsizetype index) const { return &m_bindings.at(index); }
    qsizetype bindingCount() const { return m_bindings.count(); }

    void setAttributes(std::initializer_list<QRhiVertexInputAttribute> list) { m_attributes = list; }
    template<typename InputIterator>
    void setAttributes(InputIterator first, InputIterator last)
    {
        m_attributes.clear();
        std::copy(first, last, std::back_inserter(m_attributes));
    }
    const QRhiVertexInputAttribute *cbeginAttributes() const { return m_attributes.cbegin(); }
    const QRhiVertexInputAttribute *cendAttributes() const { return m_attributes.cend(); }
    const QRhiVertexInputAttribute *attributeAt(qsizetype index) const { return &m_attributes.at(index); }
    qsizetype attributeCount() const { return m_attributes.count(); }

private:
    QVarLengthArray<QRhiVertexInputBinding, 8> m_bindings;
    QVarLengthArray<QRhiVertexInputAttribute, 8> m_attributes;

    friend bool operator==(const QRhiVertexInputLayout &a, const QRhiVertexInputLayout &b) noexcept
    {
        return a.m_bindings == b.m_bindings && a.m_attributes == b.m_attributes;
    }

    friend bool operator!=(const QRhiVertexInputLayout &a, const QRhiVertexInputLayout &b) noexcept
    {
        return !(a == b);
    }

    friend size_t qHash(const QRhiVertexInputLayout &v, size_t seed = 0) noexcept
    {
        QtPrivate::QHashCombine hash;
        seed = hash(seed, v.m_bindings);
        seed = hash(seed, v.m_attributes);
        return seed;
    }

    friend Q_GUI_EXPORT QDebug operator<<(QDebug, const QRhiVertexInputLayout &);
}